

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O3

void cycle(uint64_t error,int start,int depth,uint64_t codeword)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  UT_hash_handle *pUVar7;
  UT_hash_table *pUVar8;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar9;
  UT_hash_handle *pUVar10;
  ulong uVar11;
  syndrome_struct *psVar12;
  UT_hash_table *pUVar13;
  syndrome_struct *psVar14;
  UT_hash_bucket *pUVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  
  if (start < 0x3a) {
    uVar24 = (ulong)(uint)start;
    do {
      uVar22 = error | 1L << (uVar24 & 0x3f);
      if (depth + -1 == 0) {
        uVar11 = uVar22 ^ 0xcc7b7268ff614e1b;
        uVar23 = (uint)(uVar11 >> 0x20);
        uVar3 = sw_check_table4[uVar23 & 0xff];
        uVar4 = sw_check_table5[uVar23 >> 8 & 0xff];
        uVar5 = sw_check_table6[(ushort)(uVar11 >> 0x30) & 0xff];
        uVar6 = sw_check_table7[uVar11 >> 0x38];
        psVar12 = (syndrome_struct *)malloc(0x48);
        psVar12->syndrome = uVar11 & 0xffffffff ^ uVar3 ^ uVar4 ^ uVar5 ^ uVar6;
        psVar12->error = uVar22;
        pUVar1 = &psVar12->hh;
        (psVar12->hh).next = (void *)0x0;
        (psVar12->hh).key = psVar12;
        (psVar12->hh).keylen = 8;
        psVar14 = syndrome_map;
        if (syndrome_map == (syndrome_struct *)0x0) {
          syndrome_map = psVar12;
          (psVar12->hh).prev = (void *)0x0;
          pUVar13 = (UT_hash_table *)calloc(1,0x40);
          (psVar12->hh).tbl = pUVar13;
          if (pUVar13 == (UT_hash_table *)0x0) goto LAB_001056a8;
          pUVar13->tail = pUVar1;
          pUVar13->num_buckets = 0x20;
          pUVar13->log2_num_buckets = 5;
          pUVar13->hho = 0x10;
          pUVar15 = (UT_hash_bucket *)calloc(1,0x200);
          pUVar13->buckets = pUVar15;
          if (pUVar15 == (UT_hash_bucket *)0x0) goto LAB_001056a8;
          pUVar13->signature = 0xa0111fe1;
          psVar14 = psVar12;
        }
        else {
          pUVar13 = (syndrome_map->hh).tbl;
          pUVar7 = pUVar13->tail;
          pUVar7->next = psVar12;
          (psVar12->hh).prev = (void *)((long)pUVar7 - pUVar13->hho);
          pUVar13->tail = pUVar1;
        }
        uVar19 = pUVar13->num_items + 1;
        pUVar13->num_items = uVar19;
        (psVar12->hh).tbl = pUVar13;
        iVar16 = *(int *)((long)&psVar12->syndrome + 4) + -0x61c88647;
        uVar20 = (uint)(byte)psVar12->syndrome +
                 ((uint)*(byte *)((long)&psVar12->syndrome + 3) * 0x1000000 - iVar16) +
                 (uint)*(byte *)((long)&psVar12->syndrome + 1) * 0x100 +
                 (uint)*(byte *)((long)&psVar12->syndrome + 2) * 0x10000 + 0x9f49bac2 ^ 0x7f76d;
        uVar17 = uVar20 << 8 ^ (iVar16 - uVar20) + 0x1124109;
        uVar23 = uVar17 >> 0xd ^ (-0x1124109 - uVar20) - uVar17;
        uVar20 = uVar23 >> 0xc ^ (uVar20 - uVar17) - uVar23;
        uVar21 = uVar20 << 0x10 ^ (uVar17 - uVar23) - uVar20;
        uVar17 = uVar21 >> 5 ^ (uVar23 - uVar20) - uVar21;
        uVar23 = uVar17 >> 3 ^ (uVar20 - uVar21) - uVar17;
        uVar20 = uVar23 << 10 ^ (uVar21 - uVar17) - uVar23;
        uVar23 = uVar20 >> 0xf ^ uVar17 - (uVar23 + uVar20);
        (psVar12->hh).hashv = uVar23;
        pUVar8 = (psVar14->hh).tbl;
        uVar23 = pUVar8->num_buckets - 1 & uVar23;
        pUVar15 = pUVar8->buckets;
        uVar17 = pUVar15[uVar23].count + 1;
        codeword = (uint64_t)uVar17;
        pUVar15[uVar23].count = uVar17;
        pUVar7 = pUVar15[uVar23].hh_head;
        (psVar12->hh).hh_next = pUVar7;
        (psVar12->hh).hh_prev = (UT_hash_handle *)0x0;
        if (pUVar7 != (UT_hash_handle *)0x0) {
          pUVar7->hh_prev = pUVar1;
        }
        pUVar15[uVar23].hh_head = pUVar1;
        if ((pUVar15[uVar23].expand_mult * 10 + 10 <= uVar17) && (pUVar13->noexpand != 1)) {
          uVar23 = pUVar13->num_buckets;
          pUVar15 = (UT_hash_bucket *)calloc(1,(ulong)(uVar23 * 2) << 4);
          if (pUVar15 == (UT_hash_bucket *)0x0) {
LAB_001056a8:
            exit(-1);
          }
          uVar20 = uVar23 * 2 - 1;
          uVar17 = ((uVar19 >> ((char)pUVar13->log2_num_buckets + 1U & 0x1f)) + 1) -
                   (uint)((uVar20 & uVar19) == 0);
          pUVar13->ideal_chain_maxlen = uVar17;
          pUVar13->nonideal_items = 0;
          __ptr = pUVar13->buckets;
          if ((ulong)uVar23 != 0) {
            uVar19 = 0;
            uVar22 = 0;
            do {
              pUVar7 = __ptr[uVar22].hh_head;
              while (pUVar7 != (UT_hash_handle *)0x0) {
                pUVar9 = pUVar7->hh_next;
                uVar18 = pUVar7->hashv & uVar20;
                pUVar2 = pUVar15 + uVar18;
                uVar21 = pUVar15[uVar18].count + 1;
                pUVar15[uVar18].count = uVar21;
                if (uVar17 < uVar21) {
                  uVar19 = uVar19 + 1;
                  pUVar13->nonideal_items = uVar19;
                  pUVar2->expand_mult = uVar21 / uVar17;
                }
                pUVar7->hh_prev = (UT_hash_handle *)0x0;
                pUVar10 = pUVar2->hh_head;
                pUVar7->hh_next = pUVar10;
                if (pUVar10 != (UT_hash_handle *)0x0) {
                  pUVar10->hh_prev = pUVar7;
                }
                pUVar2->hh_head = pUVar7;
                pUVar7 = pUVar9;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar23);
          }
          free(__ptr);
          pUVar13 = pUVar1->tbl;
          pUVar13->num_buckets = pUVar13->num_buckets << 1;
          pUVar13->log2_num_buckets = pUVar13->log2_num_buckets + 1;
          pUVar13->buckets = pUVar15;
          uVar23 = pUVar13->num_items >> 1;
          codeword = (uint64_t)uVar23;
          if (uVar23 < pUVar13->nonideal_items) {
            uVar23 = pUVar13->ineff_expands + 1;
            codeword = (uint64_t)uVar23;
            pUVar13->ineff_expands = uVar23;
            if (1 < uVar23) {
              pUVar13->noexpand = 1;
            }
          }
          else {
            pUVar13->ineff_expands = 0;
          }
        }
      }
      else {
        cycle(uVar22,(int)uVar24 + 1,depth + -1,codeword);
      }
      uVar23 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar23;
    } while (uVar23 != 0x3a);
  }
  return;
}

Assistant:

static void cycle(uint64_t error, int start, int depth, uint64_t codeword)
{
	uint64_t new_error, syndrome, base;
	int i;
	base = 1;
	depth -= 1;
	for (i = start; i < 58; i++)
	{
		new_error = (base << i);
		new_error |= error;
		if (depth)
			cycle(new_error, i + 1, depth, codeword);
		else {
			syndrome = gen_syndrome(codeword ^ new_error);
			add_syndrome(syndrome, new_error);
		}
	}
}